

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

char * fgets3(FILE *file,char *line,int nbChar)

{
  char cVar1;
  char *pcVar2;
  
  if (nbChar < 2) {
    return (char *)0x0;
  }
  do {
    while( true ) {
      pcVar2 = fgets(line,nbChar,(FILE *)file);
      cVar1 = *line;
      if ((cVar1 == '#') || (cVar1 == '%')) break;
      if (cVar1 != '/') goto LAB_0011cf83;
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      if (line[1] != '/') {
        return pcVar2;
      }
    }
  } while (pcVar2 != (char *)0x0);
LAB_0011cf83:
  if (cVar1 == '$') {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

inline char* fgets3(FILE* file, char* line, int nbChar)
{ 
	char* r = NULL;

	if (nbChar < 2)
	{
		return NULL;
	}

	do   
	{
		r = fgets(line, nbChar, file);
	} 
	while ((
		(line[0] == '%')||
		(line[0] == '#')||
		((line[0] == '/')&&(line[1] == '/'))
		) && (r != NULL));

	if (line[0] == '$')
	{
		r = NULL;
	}

	return r;
}